

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall dxil_spv::CFGStructurizer::insert_phi(CFGStructurizer *this)

{
  pointer ppCVar1;
  mapped_type pCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  CFGNode *this_00;
  pointer pPVar5;
  pointer ppOVar6;
  pointer pPVar7;
  long lVar8;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __position;
  pointer ppCVar9;
  mapped_type *ppCVar10;
  ulong uVar11;
  uint uVar12;
  __normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
  __i;
  pointer ppOVar13;
  pointer pPVar14;
  PHI *phi;
  pointer __k;
  PHINode *phi_node;
  pointer pPVar15;
  CFGNode *back_edge;
  PHINode local_50;
  pointer local_40;
  pointer local_38;
  
  ppCVar9 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppCVar9 == ppCVar1) {
      prune_dead_preds(this);
      fixup_broken_value_dominance(this);
      local_40 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppCVar9 = (this->forward_post_visit_order).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (ppCVar9 != local_40) {
        pCVar2 = *ppCVar9;
        pPVar5 = (pCVar2->ir).phi.
                 super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar12 = 0;
        local_38 = ppCVar9;
        for (__k = (pCVar2->ir).phi.
                   super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != pPVar5; __k = __k + 1) {
          local_50.block = pCVar2;
          local_50.phi_index = uVar12;
          std::
          vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
          ::emplace_back<dxil_spv::CFGStructurizer::PHINode>(&this->phi_nodes,&local_50);
          if (__k->id != 0) {
            ppCVar10 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->value_id_to_block,&__k->id);
            *ppCVar10 = pCVar2;
          }
          uVar12 = uVar12 + 1;
        }
        ppOVar6 = (pCVar2->ir).operations.
                  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppOVar13 = (pCVar2->ir).operations.
                        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppOVar13 != ppOVar6;
            ppOVar13 = ppOVar13 + 1) {
          if ((*ppOVar13)->id != 0) {
            ppCVar10 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->value_id_to_block,&(*ppOVar13)->id);
            *ppCVar10 = pCVar2;
          }
        }
        ppCVar9 = local_38 + 1;
      }
      pPVar15 = (this->phi_nodes).
                super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar7 = (this->phi_nodes).
               super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar15 != pPVar7) {
        uVar11 = (long)pPVar7 - (long)pPVar15 >> 4;
        lVar8 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                  (pPVar15,pPVar7,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pPVar7 - (long)pPVar15 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar15,pPVar7);
        }
        else {
          pPVar14 = pPVar15 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar15,pPVar14);
          for (; pPVar14 != pPVar7; pPVar14 = pPVar14 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Val_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                      (pPVar14);
          }
        }
      }
      pPVar7 = (this->phi_nodes).
               super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar15 = (this->phi_nodes).
                     super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar15 != pPVar7;
          pPVar15 = pPVar15 + 1) {
        fixup_phi(this,pPVar15);
        insert_phi(this,pPVar15);
      }
      return;
    }
    pCVar2 = (*ppCVar9)->pred_back_edge;
    if (((pCVar2 != (mapped_type)0x0) && ((pCVar2->ir).terminator.type == Branch)) &&
       (pCVar2->succ_back_edge == (pCVar2->ir).terminator.direct_block)) {
      ppCVar3 = (pCVar2->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar4 = (pCVar2->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppCVar4 - (long)ppCVar3 == 8) {
        this_00 = *ppCVar3;
        if (ppCVar4 != ppCVar3) {
          (pCVar2->succ).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar3;
        }
        local_50.block = pCVar2;
        __position = std::
                     __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                               ((this_00->pred).
                                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this_00->pred).
                                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        if (__position._M_current ==
            (this_00->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("itr != succ->pred.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x807,"void dxil_spv::CFGStructurizer::insert_phi()");
        }
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        erase(&this_00->pred,(const_iterator)__position._M_current);
        CFGNode::recompute_immediate_dominator(this_00);
      }
    }
    ppCVar9 = ppCVar9 + 1;
  } while( true );
}

Assistant:

void CFGStructurizer::insert_phi()
{
	// If we inserted dummy branches from back-edge to rewrite infinite loops, we must prune these branches
	// now, so we don't end up creating a wrong amount of PHI incoming values.
	// We don't have to recompute the CFG since we don't really care about post-visit orders at this stage.
	for (auto *node : forward_post_visit_order)
	{
		if (node->pred_back_edge && node->pred_back_edge->ir.terminator.type == Terminator::Type::Branch &&
		    node->pred_back_edge->succ_back_edge == node->pred_back_edge->ir.terminator.direct_block &&
		    node->pred_back_edge->succ.size() == 1)
		{
			auto *back_edge = node->pred_back_edge;
			auto *succ = back_edge->succ.front();
			back_edge->succ.clear();
			auto itr = std::find(succ->pred.begin(), succ->pred.end(), back_edge);
			assert(itr != succ->pred.end());
			succ->pred.erase(itr);
			succ->recompute_immediate_dominator();
		}
	}

	prune_dead_preds();

	// It is possible that an SSA value was created in a block, and consumed in another.
	// With CFG rewriting branches, it is possible that dominance relationship no longer holds
	// and we must insert new dummy IDs to resolve this.
	fixup_broken_value_dominance();

	// Build a map of value ID -> creating block.
	// This allows us to detect if a value is consumed in a situation where the declaration does not dominate use.
	// This can happen when introducing ladder blocks or similar.
	for (auto *node : forward_post_visit_order)
	{
		unsigned phi_index = 0;
		for (auto &phi : node->ir.phi)
		{
			phi_nodes.push_back({ node, phi_index });
			if (phi.id)
				value_id_to_block[phi.id] = node;
			phi_index++;
		}

		for (auto *op : node->ir.operations)
			if (op->id)
				value_id_to_block[op->id] = node;
	}

	// Resolve phi-nodes top-down since PHI nodes may depend on other PHI nodes.
	std::sort(phi_nodes.begin(), phi_nodes.end(),
	          [](const PHINode &a, const PHINode &b) { return a.block->forward_post_visit_order > b.block->forward_post_visit_order; });

	for (auto &phi_node : phi_nodes)
	{
		fixup_phi(phi_node);
		insert_phi(phi_node);
	}
}